

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer_matrix_uniform.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  double *pdVar6;
  istream *piVar7;
  long *plVar8;
  ostream *poVar9;
  undefined8 uVar10;
  double dVar11;
  int L;
  double t_max;
  double H;
  double J;
  double t_step;
  double t_min;
  allocator local_99;
  string local_98;
  undefined7 uStack_97;
  long local_88 [2];
  int local_74;
  char *local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  if (argc < 7) {
LAB_0010243a:
    pdVar6 = (double *)std::istream::operator>>((istream *)&std::cin,&local_74);
    piVar7 = std::istream::_M_extract<double>(pdVar6);
    piVar7 = std::istream::_M_extract<double>((double *)piVar7);
    piVar7 = std::istream::_M_extract<double>((double *)piVar7);
    piVar7 = std::istream::_M_extract<double>((double *)piVar7);
    std::istream::_M_extract<double>((double *)piVar7);
    goto LAB_0010266f;
  }
  std::__cxx11::string::string(&local_98,argv[1],&local_99);
  pcVar2 = (char *)CONCAT71(uStack_97,local_98);
  piVar4 = __errno_location();
  iVar1 = *piVar4;
  *piVar4 = 0;
  lVar5 = strtol(pcVar2,&local_70,10);
  if (local_70 == pcVar2) {
    std::__throw_invalid_argument("stoi");
LAB_0010287a:
    std::__throw_out_of_range("stoi");
LAB_00102886:
    std::__throw_invalid_argument("stod");
LAB_00102892:
    std::__throw_invalid_argument("stod");
LAB_0010289e:
    std::__throw_invalid_argument("stod");
  }
  else {
    iVar3 = (int)lVar5;
    if ((iVar3 != lVar5) || (*piVar4 == 0x22)) goto LAB_0010287a;
    if (*piVar4 == 0) {
      *piVar4 = iVar1;
    }
    local_74 = iVar3;
    if ((long *)CONCAT71(uStack_97,local_98) != local_88) {
      operator_delete((long *)CONCAT71(uStack_97,local_98),local_88[0] + 1);
    }
    std::__cxx11::string::string(&local_98,argv[2],&local_99);
    pcVar2 = (char *)CONCAT71(uStack_97,local_98);
    iVar1 = *piVar4;
    *piVar4 = 0;
    dVar11 = strtod(pcVar2,&local_70);
    if (local_70 == pcVar2) goto LAB_00102886;
    if (*piVar4 == 0) {
      *piVar4 = iVar1;
    }
    else if (*piVar4 == 0x22) {
      std::__throw_out_of_range("stod");
      goto LAB_0010243a;
    }
    local_58 = dVar11;
    if ((long *)CONCAT71(uStack_97,local_98) != local_88) {
      operator_delete((long *)CONCAT71(uStack_97,local_98),local_88[0] + 1);
    }
    std::__cxx11::string::string(&local_98,argv[3],&local_99);
    pcVar2 = (char *)CONCAT71(uStack_97,local_98);
    iVar1 = *piVar4;
    *piVar4 = 0;
    dVar11 = strtod(pcVar2,&local_70);
    if (local_70 == pcVar2) goto LAB_00102892;
    if (*piVar4 == 0) {
LAB_00102501:
      *piVar4 = iVar1;
    }
    else if (*piVar4 == 0x22) {
      dVar11 = (double)std::__throw_out_of_range("stod");
      goto LAB_00102501;
    }
    local_60 = dVar11;
    if ((long *)CONCAT71(uStack_97,local_98) != local_88) {
      operator_delete((long *)CONCAT71(uStack_97,local_98),local_88[0] + 1);
    }
    std::__cxx11::string::string(&local_98,argv[4],&local_99);
    pcVar2 = (char *)CONCAT71(uStack_97,local_98);
    iVar1 = *piVar4;
    *piVar4 = 0;
    dVar11 = strtod(pcVar2,&local_70);
    if (local_70 == pcVar2) goto LAB_0010289e;
    if (*piVar4 == 0) {
LAB_00102571:
      *piVar4 = iVar1;
    }
    else if (*piVar4 == 0x22) {
      dVar11 = (double)std::__throw_out_of_range("stod");
      goto LAB_00102571;
    }
    local_40 = dVar11;
    if ((long *)CONCAT71(uStack_97,local_98) != local_88) {
      operator_delete((long *)CONCAT71(uStack_97,local_98),local_88[0] + 1);
    }
    std::__cxx11::string::string(&local_98,argv[5],&local_99);
    pcVar2 = (char *)CONCAT71(uStack_97,local_98);
    iVar1 = *piVar4;
    *piVar4 = 0;
    dVar11 = strtod(pcVar2,&local_70);
    if (local_70 != pcVar2) {
      if (*piVar4 == 0) {
LAB_001025e1:
        *piVar4 = iVar1;
      }
      else if (*piVar4 == 0x22) {
        dVar11 = (double)std::__throw_out_of_range("stod");
        goto LAB_001025e1;
      }
      local_68 = dVar11;
      if ((long *)CONCAT71(uStack_97,local_98) != local_88) {
        operator_delete((long *)CONCAT71(uStack_97,local_98),local_88[0] + 1);
      }
      std::__cxx11::string::string(&local_98,argv[6],&local_99);
      pcVar2 = (char *)CONCAT71(uStack_97,local_98);
      iVar1 = *piVar4;
      *piVar4 = 0;
      local_48 = strtod(pcVar2,&local_70);
      if (local_70 == pcVar2) goto LAB_001028b6;
      if (*piVar4 == 0) {
LAB_00102650:
        *piVar4 = iVar1;
      }
      else if (*piVar4 == 0x22) {
        local_48 = (double)std::__throw_out_of_range("stod");
        goto LAB_00102650;
      }
      if ((long *)CONCAT71(uStack_97,local_98) != local_88) {
        operator_delete((long *)CONCAT71(uStack_97,local_98),local_88[0] + 1);
      }
LAB_0010266f:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# L = ",6);
      plVar8 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_74);
      std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
      std::ostream::put((char)plVar8);
      poVar9 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"# J = ",6);
      poVar9 = std::ostream::_M_insert<double>(local_58);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      poVar9 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"# H = ",6);
      poVar9 = std::ostream::_M_insert<double>(local_60);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      lVar5 = std::cout;
      *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) & 0xfffffefb | 0x100;
      *(undefined8 *)(strtol + *(long *)(lVar5 + -0x18)) = 0xb;
      if (local_40 <= local_68) {
        local_50 = local_40;
        do {
          iVar1 = local_74;
          local_38 = ising::square::transfer_matrix::free_energy
                               (1.0 / local_50,local_74,local_74,local_58,local_60);
          local_38 = local_38 / (double)(iVar1 * iVar1);
          poVar9 = std::ostream::_M_insert<double>(local_50);
          local_98 = (string)0x20;
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_98,1);
          poVar9 = std::ostream::_M_insert<double>(local_38);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          local_50 = local_50 + local_48;
        } while (local_50 <= local_68);
      }
      return 0;
    }
  }
  std::__throw_invalid_argument("stod");
LAB_001028b6:
  uVar10 = std::__throw_invalid_argument("stod");
  _Unwind_Resume(uVar10);
}

Assistant:

int main(int argc, char **argv) {
  int L; // system size
  double J, H;
  double t_min, t_max, t_step;
  if (argc >=7) {
    L = std::stoi(argv[1]);
    J = std::stod(argv[2]);
    H = std::stod(argv[3]);
    t_min = std::stod(argv[4]);
    t_max = std::stod(argv[5]);
    t_step = std::stod(argv[6]);
  } else {
    std::cin >> L >> J >> H >> t_min >> t_max >> t_step;
  }
  std::cout << "# L = " << L << std::endl
            << "# J = " << J << std::endl
            << "# H = " << H << std::endl;
  std::cout << std::scientific << std::setprecision(11);
  for (double t = t_min; t <= t_max; t += t_step) {
    double beta = 1 / t;
    double f = ising::square::transfer_matrix::free_energy_density(beta, L, L, J, H);
    std::cout << t << ' ' << f << std::endl;
  }
}